

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O3

void __thiscall chrono::fea::ChLinkBeamIGAslider::UpdateNodes(ChLinkBeamIGAslider *this)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer psVar3;
  long *plVar4;
  pointer psVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int ip;
  int iVar6;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *i;
  size_t sVar7;
  pointer psVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  ChVectorDynamic<> N;
  ChVector<double> absoutlet;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_e8;
  ChVariables *local_d0;
  double local_c8;
  double local_c0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double local_80;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_78;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_60;
  double local_48;
  double local_40;
  double local_38;
  
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(&this->m_nodes);
  plVar4 = (long *)(**(code **)(*(long *)&((((this->m_beams).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->super_ChElementBeam + 0xd0))();
  this->order = (int)((ulong)(plVar4[1] - *plVar4) >> 4) + -1;
  this->active_element = 0;
  this->tau = 0.0;
  local_b8.m_storage.m_data = (double *)0x0;
  local_b8.m_storage.m_rows = 0;
  local_a8 = VNULL;
  dStack_a0 = DAT_00b689a0;
  local_98 = DAT_00b689a8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_b8,
             (long)(int)((ulong)((long)(this->m_nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  ChTransform<double>::TransformLocalToParent
            (&(this->m_csys).pos,
             &(peVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(peVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  psVar5 = (this->m_beams).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_beams).
      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    sVar7 = 0;
    local_c0 = 1e+30;
    do {
      local_c8 = ChElementBeamIGA::GetU1
                           (psVar5[sVar7].
                            super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
      local_88 = ChElementBeamIGA::GetU2
                           ((this->m_beams).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar7].
                            super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
      local_88 = local_88 - local_c8;
      iVar6 = 0;
      do {
        peVar2 = (this->m_beams).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar7].
                 super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_80 = local_c8 + (local_88 * (double)iVar6) / 5.0;
        (**(code **)(*(long *)&peVar2->super_ChElementBeam + 0xe8))
                  (((local_80 - local_c8) + (local_80 - local_c8)) / local_88 + -1.0,peVar2,
                   &local_a8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_a8 - local_48;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (dStack_a0 - local_40) * (dStack_a0 - local_40);
        auVar9 = vfmadd231sd_fma(auVar10,auVar9,auVar9);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_98 - local_38;
        auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
        auVar9 = vsqrtsd_avx(auVar9,auVar9);
        if (auVar9._0_8_ < local_c0) {
          this->tau = local_80;
          this->active_element = sVar7;
          local_c0 = auVar9._0_8_;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != 6);
      psVar5 = (this->m_beams).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar7 = sVar7 + 1;
    } while (sVar7 < (ulong)((long)(this->m_beams).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  iVar6 = (*((psVar5[this->active_element].
              super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
            [0x1a])();
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::operator=(&this->m_nodes,
              (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               *)CONCAT44(extraout_var,iVar6));
  local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
  local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (ChVariables **)0x0;
  psVar8 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar3) {
    do {
      iVar6 = (*(((psVar8->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[8])();
      local_d0 = (ChVariables *)CONCAT44(extraout_var_00,iVar6);
      if (local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
        _M_realloc_insert<chrono::ChVariables*>
                  ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_e8,
                   (iterator)
                   local_e8.
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_d0);
      }
      else {
        *local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_d0;
        local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_e8.
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar3);
  }
  iVar6 = (*(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  local_d0 = (ChVariables *)CONCAT44(extraout_var_01,iVar6);
  if (local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_e8,
               (iterator)
               local_e8.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_d0);
  }
  else {
    *local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_d0;
    local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_60,&local_e8);
  ChConstraintNgeneric::SetVariables(&this->constraint2,&local_60);
  if (local_60.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_78,&local_e8);
  ChConstraintNgeneric::SetVariables(&this->constraint3,&local_78);
  if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_storage.m_data != (double *)0x0) {
    free((void *)local_b8.m_storage.m_data[-1]);
  }
  return;
}

Assistant:

void ChLinkBeamIGAslider::UpdateNodes() {
    m_nodes.clear();

    this->order = (int)m_beams[0]->GetNodes().size() - 1;

    // fetch the element and the tau
    this->tau = 0;
    this->active_element = 0;
    int nnodes = (int)this->m_nodes.size();
    ChVector<> point = VNULL;
    ChVector<> goodpoint = VNULL;
    ChVectorDynamic<> N(nnodes);
    int nsamples = 6;  //***TODO*** search via NR
    double mdist = 1e30;
    ChVector<> absoutlet = this->m_body->TransformPointLocalToParent(this->m_csys.pos);

    for (size_t iel = 0; iel < m_beams.size(); ++iel) {
        double u1 = m_beams[iel]->GetU1();
        double u2 = m_beams[iel]->GetU2();

        for (int ip = 0; ip < nsamples; ++ip) {
            double u = u1 + (u2 - u1) * (double)ip / ((double)(nsamples - 1));
            double eta = (2.0 * (u - u1) / (u2 - u1)) - 1.0;
            m_beams[iel]->EvaluateSectionPoint(eta, point);

            double trydist = (point - absoutlet).Length();
            if (trydist < mdist) {
                mdist = trydist;
                this->tau = u;
                this->active_element = iel;
                goodpoint = point;
            }
        }
    }
    //***TEST
    // double u1 = m_beams[this->active_element]->GetU1();
    // double u2 = m_beams[this->active_element]->GetU2();
    // double eta = (2.0*(this->tau - u1) / (u2 - u1)) - 1.0;
    // m_beams[this->active_element]->EvaluateSectionPoint(eta, point);
    // GetLog() << "Update tau=" << this->tau << " eta=" << eta << " dist=" << mdist << " elem n." <<
    // this->active_element << " on " << m_beams.size() << " pos=" << goodpoint << " outlet=" << absoutlet << "\n";

    m_nodes = m_beams[this->active_element]->GetNodes();

    // update variables pointers
    std::vector<ChVariables*> mvars;
    for (auto& i : this->m_nodes) {
        mvars.push_back(&(i->Variables()));
    }
    mvars.push_back(&(m_body->Variables()));

    // constraint1.SetVariables(mvars);
    constraint2.SetVariables(mvars);
    constraint3.SetVariables(mvars);
}